

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_cod_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  undefined8 uVar2;
  OPJ_UINT32 OVar3;
  opj_bool oVar4;
  opj_tcp_v2_t *poVar5;
  long lVar6;
  uint uVar7;
  OPJ_UINT32 *pOVar8;
  ulong __n;
  OPJ_UINT32 p_header_size_local;
  opj_image_t *local_48;
  opj_j2k_v2_t *local_40;
  OPJ_UINT32 l_tmp;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar5 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar5 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  p_header_size_local = p_header_size;
  if (4 < p_header_size) {
    local_48 = p_j2k->m_private_image;
    opj_read_bytes_LE(p_header_data,&poVar5->csty,1);
    opj_read_bytes_LE(p_header_data + 1,&l_tmp,1);
    poVar5->prg = l_tmp;
    opj_read_bytes_LE(p_header_data + 2,&poVar5->numlayers,2);
    OVar3 = (p_j2k->m_cp).m_specific_param.m_dec.m_layer;
    if (OVar3 == 0) {
      OVar3 = poVar5->numlayers;
    }
    poVar5->num_layers_to_decode = OVar3;
    opj_read_bytes_LE(p_header_data + 4,&poVar5->mct,1);
    p_header_size_local = p_header_size_local - 5;
    uVar7 = local_48->numcomps;
    for (lVar6 = 0; (ulong)uVar7 * 0x438 - lVar6 != 0; lVar6 = lVar6 + 0x438) {
      *(OPJ_UINT32 *)((long)poVar5->tccps->stepsizes + lVar6 + -0x1c) = poVar5->csty & 1;
    }
    oVar4 = j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data + 5,&p_header_size_local,p_manager);
    if ((oVar4 != 0) && (p_header_size_local == 0)) {
      if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
        poVar5 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
      }
      else {
        poVar5 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      }
      poVar1 = poVar5->tccps;
      __n = (ulong)(poVar1->numresolutions << 2);
      pOVar8 = &poVar1[1].numresolutions;
      local_40 = p_j2k;
      for (uVar7 = 1; uVar7 < local_40->m_private_image->numcomps; uVar7 = uVar7 + 1) {
        uVar2 = *(undefined8 *)&poVar1->cblkh;
        *(undefined8 *)pOVar8 = *(undefined8 *)&poVar1->numresolutions;
        *(undefined8 *)(pOVar8 + 2) = uVar2;
        pOVar8[4] = poVar1->qmfbid;
        memcpy(pOVar8 + 0xca,poVar1->prcw,__n);
        memcpy(pOVar8 + 0xeb,poVar1->prch,__n);
        pOVar8 = pOVar8 + 0x10e;
      }
      return 1;
    }
  }
  opj_event_msg_v2(p_manager,1,"Error reading COD marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_cod_v2 (
					opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	/* loop */
	OPJ_UINT32 i;
	OPJ_UINT32 l_tmp;
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_image_t *l_image = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* If we are in the first tile-part header of the current tile */
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* Make sure room is sufficient */
	if (p_header_size < 5) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_tcp->csty,1);		/* Scod */
	++p_header_data;
	opj_read_bytes(p_header_data,&l_tmp,1);				/* SGcod (A) */
	++p_header_data;
	l_tcp->prg = (OPJ_PROG_ORDER) l_tmp;
	opj_read_bytes(p_header_data,&l_tcp->numlayers,2);	/* SGcod (B) */
	p_header_data+=2;

	/* If user didn't set a number layer to decode take the max specify in the codestream. */
	if	(l_cp->m_specific_param.m_dec.m_layer) {
		l_tcp->num_layers_to_decode = l_cp->m_specific_param.m_dec.m_layer;
	}
	else {
		l_tcp->num_layers_to_decode = l_tcp->numlayers;
	}

	opj_read_bytes(p_header_data,&l_tcp->mct,1);		/* SGcod (C) */
	++p_header_data;

	p_header_size -= 5;
	for	(i = 0; i < l_image->numcomps; ++i) {
		l_tcp->tccps[i].csty = l_tcp->csty & J2K_CCP_CSTY_PRT;
	}

	if (! j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	/* Apply the coding style to other components of the current tile or the m_default_tcp*/
	j2k_copy_tile_component_parameters(p_j2k);

	/* Index */
#ifdef WIP_REMOVE_MSD
	if (p_j2k->cstr_info) {
		/*opj_codestream_info_t *l_cstr_info = p_j2k->cstr_info;*/
		p_j2k->cstr_info->prog = l_tcp->prg;
		p_j2k->cstr_info->numlayers = l_tcp->numlayers;
		p_j2k->cstr_info->numdecompos = (OPJ_INT32*) opj_malloc(l_image->numcomps * sizeof(OPJ_UINT32));
		for	(i = 0; i < l_image->numcomps; ++i) {
			p_j2k->cstr_info->numdecompos[i] = l_tcp->tccps[i].numresolutions - 1;
		}
	}
#endif

	return OPJ_TRUE;
}